

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field_Zp.h
# Opt level: O1

int __thiscall Gudhi::persistent_cohomology::Field_Zp::init(Field_Zp *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  iterator iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  invalid_argument *this_01;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_30 [2];
  
  iVar6 = (int)ctx;
  this->Prime = iVar6;
  if (iVar6 < 0xb502) {
    if (1 < iVar6) {
      this_00 = &this->inverse_;
      piVar1 = (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
      std::vector<int,_std::allocator<int>_>::reserve(this_00,(ulong)ctx & 0xffffffff);
      local_30[1] = 0;
      iVar2._M_current =
           (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,local_30 + 1);
        local_30[0] = extraout_EAX_00;
      }
      else {
        *iVar2._M_current = 0;
        (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        local_30[0] = extraout_EAX;
      }
      iVar6 = this->Prime;
      if (1 < iVar6) {
        iVar5 = 1;
        iVar8 = 2;
        do {
          local_30[0] = 1;
          if (iVar5 % iVar6 != 1) {
            local_30[0] = 1;
            iVar7 = iVar5;
            iVar3 = iVar8;
            do {
              if (iVar6 == iVar7) {
                local_30[0] = local_30[0] + 1;
                this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (this_01,"homology_coeff_field must be a prime number");
                goto LAB_0011a3d5;
              }
              iVar4 = iVar3 % iVar6;
              iVar7 = iVar7 + iVar5;
              iVar3 = iVar3 + iVar5;
              local_30[0] = local_30[0] + 1;
            } while (iVar4 != 1);
          }
          iVar2._M_current =
               (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)this_00,iVar2,local_30);
            local_30[0] = extraout_EAX_01;
          }
          else {
            *iVar2._M_current = local_30[0];
            (this->inverse_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          iVar5 = iVar5 + 1;
          iVar6 = this->Prime;
          iVar8 = iVar8 + 2;
        } while (iVar5 < iVar6);
      }
      return local_30[0];
    }
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"homology_coeff_field must be a prime number");
  }
  else {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"Maximum homology_coeff_field allowed value is 46337");
  }
LAB_0011a3d5:
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void init(int charac) {
    Prime = charac;

    // Check that the provided prime is less than the maximum allowed as int, calculation below, and 'plus_times_equal' function : 46337 ; i.e (max_prime-1)*max_prime <= INT_MAX
    if(Prime > 46337)
        throw std::invalid_argument("Maximum homology_coeff_field allowed value is 46337");

    // Check for primality
    if (Prime <= 1)
        throw std::invalid_argument("homology_coeff_field must be a prime number");

    inverse_.clear();
    inverse_.reserve(charac);
    inverse_.push_back(0);
    for (int i = 1; i < Prime; ++i) {
      int inv = 1;
      int mult = inv * i;
      while ( (mult % Prime) != 1) {
        ++inv;
        if(mult == Prime)
            throw std::invalid_argument("homology_coeff_field must be a prime number");
        mult = inv * i;
      }
      inverse_.push_back(inv);
    }
  }